

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcryptographichash.cpp
# Opt level: O3

void __thiscall
QMessageAuthenticationCodePrivate::setKey
          (QMessageAuthenticationCodePrivate *this,QByteArrayView newKey)

{
  QCryptographicHashPrivate *this_00;
  HashResult *result;
  byte bVar1;
  Algorithm AVar2;
  int iVar3;
  size_t __n;
  ulong uVar4;
  ulong uVar5;
  size_t otherSize;
  
  __n = newKey.m_size;
  AVar2 = (this->messageHash).method;
  if ((ulong)AVar2 < 0x17) {
    uVar5 = *(ulong *)(&DAT_0057c150 + (ulong)AVar2 * 8);
  }
  else {
    uVar5 = 0;
  }
  if ((long)uVar5 < (long)__n) {
    this_00 = &this->messageHash;
    QCryptographicHashPrivate::State::addData((State *)this_00,AVar2,newKey);
    result = &(this->messageHash).result;
    AVar2 = (this->messageHash).method;
    iVar3 = hashLengthInternal(AVar2);
    (this->messageHash).result.m_size = (quint8)iVar3;
    QCryptographicHashPrivate::State::finalizeUnchecked((State *)this_00,AVar2,result);
    bVar1 = (this->messageHash).result.m_size;
    memcpy(this,result,(ulong)bVar1);
    (this->key).m_size = bVar1;
    (this->messageHash).result.m_size = '\0';
    QCryptographicHashPrivate::State::reset((State *)this_00,(this->messageHash).method);
    __n = (size_t)(this->key).m_size;
  }
  else {
    memcpy(this,newKey.m_data,__n);
    (this->key).m_size = (quint8)newKey.m_size;
  }
  uVar4 = __n & 0xff;
  if (uVar4 <= uVar5 && uVar5 - uVar4 != 0) {
    (this->key).m_size = (quint8)uVar5;
    memset((this->key).m_data._M_elems + uVar4,0,uVar5 - uVar4);
  }
  initMessageHash(this);
  return;
}

Assistant:

void QMessageAuthenticationCodePrivate::setKey(QByteArrayView newKey) noexcept
{
    const int blockSize = qt_hash_block_size(messageHash.method);

    if (newKey.size() > blockSize) {
        messageHash.addData(newKey);
        messageHash.finalizeUnchecked();
        static_assert([] {
                using A = QCryptographicHash::Algorithm;
                for (int i = 0; i < A::NumAlgorithms; ++i) {
                    if (hashLengthInternal(A(i)) > qt_hash_block_size(A(i)))
                        return false;
                }
                return true;
            }(), "this code assumes that a hash's result always fits into that hash's block size");
        key = messageHash.result;
        messageHash.reset();
    } else {
        key.assign(newKey);
    }

    if (key.size() < blockSize)
        key.resize(blockSize, '\0');

    initMessageHash();
}